

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O0

MatrixXd * __thiscall Filter::forward(Filter *this,MatrixXd *input)

{
  char cVar1;
  Scalar *pSVar2;
  Matrix<double,__1,__1,_0,__1,__1> *in_RDX;
  FIR *in_RSI;
  MatrixXd *in_RDI;
  double row;
  MatrixXd *this_00;
  vector<float,_std::allocator<float>_> *col;
  double in_stack_ffffffffffffffd8;
  
  col = &in_RSI->freq;
  this_00 = in_RDI;
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)in_RSI,
             (Index)in_stack_ffffffffffffffd8,(Index)col);
  row = FIR::filter(in_RSI,in_stack_ffffffffffffffd8);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)in_RSI,
                      (Index)row,(Index)col);
  *pSVar2 = row;
  cVar1 = FIR::getType((FIR *)&in_RSI->freq);
  if (cVar1 == 'h') {
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)in_RSI,
                        (Index)row,(Index)col);
    *pSVar2 = *pSVar2 + 0.5;
  }
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(this_00,in_RDX);
  return in_RDI;
}

Assistant:

Eigen::MatrixXd Filter::forward(Eigen::MatrixXd input) {
    output(0,0) = filter.filter(input(0,0));
    if(filter.getType() == 'h') {
        output(0,0) += 0.5;
    }
    return output;
}